

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pNormalIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  DeadlyImportError *pDVar6;
  reference piVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  reference pvVar10;
  reference pvVar11;
  reference paVar12;
  aiVector3t<float> *local_328;
  aiVector3t<float> *local_2e8;
  aiVector3t<float> *local_290;
  size_t vi_e;
  size_t vi;
  aiVector3D tnorm;
  size_t fi;
  size_t i_3;
  value_type_conflict1 local_220;
  ulong local_218;
  size_t i_e;
  size_t i_2;
  const_iterator normidx_it;
  string local_1f8;
  _List_const_iterator<aiVector3t<float>_> local_1d8;
  ulong local_1d0;
  size_t i_1;
  const_iterator norm_it;
  string local_1b8;
  undefined1 local_191;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong local_d0;
  size_t i;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  const_iterator it_1;
  string local_a8;
  _Self local_88;
  _Self local_80;
  const_iterator it;
  undefined1 local_68 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> norm_arr_copy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tind;
  bool pNormalPerVertex_local;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals_local;
  vector<int,_std::allocator<int>_> *pNormalIdx_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &norm_arr_copy.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_68);
  sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(pNormals)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_68,sVar4);
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(pNormals);
  while( true ) {
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(pNormals);
    bVar3 = std::operator!=(&local_80,&local_88);
    if (!bVar3) break;
    paVar12 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_80);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_68,paVar12);
    std::_List_const_iterator<aiVector3t<float>_>::operator++(&local_80);
  }
  if (pNormalPerVertex) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
    if (sVar4 == 0) {
      sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        (pNormals);
      if (sVar4 != pMesh->mNumVertices) {
        norm_it._M_node._6_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b8,
                   "MeshGeometry_AddNormal. Normals and vertices count must be equal.",
                   (allocator *)((long)&norm_it._M_node + 7));
        DeadlyImportError::DeadlyImportError(pDVar6,&local_1b8);
        norm_it._M_node._6_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar8 = (ulong)pMesh->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__(uVar8 * 0xc);
      if (uVar8 != 0) {
        local_2e8 = paVar9;
        do {
          aiVector3t<float>::aiVector3t(local_2e8);
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != paVar9 + uVar8);
      }
      pMesh->mNormals = paVar9;
      i_1 = (size_t)std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                    begin(pNormals);
      for (local_1d0 = 0; local_1d0 < pMesh->mNumVertices; local_1d0 = local_1d0 + 1) {
        local_1d8._M_node =
             (_List_node_base *)
             std::_List_const_iterator<aiVector3t<float>_>::operator++
                       ((_List_const_iterator<aiVector3t<float>_> *)&i_1,0);
        paVar12 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_1d8);
        paVar9 = pMesh->mNormals + local_1d0;
        fVar2 = paVar12->y;
        paVar9->x = paVar12->x;
        paVar9->y = fVar2;
        paVar9->z = paVar12->z;
      }
    }
    else {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pCoordIdx);
      if (sVar4 != sVar5) {
        it_1._M_current._6_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,"Normals and Coords inidces count must be equal.",
                   (allocator *)((long)&it_1._M_current + 7));
        DeadlyImportError::DeadlyImportError(pDVar6,&local_a8);
        it_1._M_current._6_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &norm_arr_copy.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,sVar4);
      local_b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pNormalIdx);
      while( true ) {
        local_c0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pNormalIdx);
        bVar3 = __gnu_cxx::operator!=(&local_b8,&local_c0);
        if (!bVar3) break;
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_b8);
        if (*piVar7 != -1) {
          piVar7 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_b8);
          i = (size_t)*piVar7;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &norm_arr_copy.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&i);
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_b8);
      }
      uVar8 = (ulong)pMesh->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__(uVar8 * 0xc);
      if (uVar8 != 0) {
        local_290 = paVar9;
        do {
          aiVector3t<float>::aiVector3t(local_290);
          local_290 = local_290 + 1;
        } while (local_290 != paVar9 + uVar8);
      }
      pMesh->mNormals = paVar9;
      local_d0 = 0;
      while( true ) {
        uVar8 = local_d0;
        bVar3 = false;
        if (local_d0 < pMesh->mNumVertices) {
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &norm_arr_copy.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = uVar8 < sVar4;
        }
        if (!bVar3) break;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &norm_arr_copy.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
        uVar8 = *pvVar10;
        sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           local_68);
        if (sVar4 <= uVar8) {
          local_191 = 1;
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &norm_arr_copy.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
          to_string<unsigned_long>(&local_170,*pvVar10);
          std::operator+(&local_150,"MeshGeometry_AddNormal. Normal index(",&local_170);
          std::operator+(&local_130,&local_150,") is out of range. Normals count: ");
          sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_68);
          to_string<unsigned_long>(&local_190,sVar4);
          std::operator+(&local_110,&local_130,&local_190);
          std::operator+(&local_f0,&local_110,".");
          DeadlyImportError::DeadlyImportError(pDVar6,&local_f0);
          local_191 = 0;
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &norm_arr_copy.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
        pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_68,*pvVar10);
        paVar9 = pMesh->mNormals + local_d0;
        fVar2 = pvVar11->y;
        paVar9->x = pvVar11->x;
        paVar9->y = fVar2;
        paVar9->z = pvVar11->z;
        local_d0 = local_d0 + 1;
      }
    }
  }
  else {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
    if (sVar4 == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &norm_arr_copy.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)pMesh->mNumFaces);
      for (fi = 0; fi < pMesh->mNumFaces; fi = fi + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &norm_arr_copy.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&fi);
      }
    }
    else {
      uVar1 = pMesh->mNumFaces;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
      if (uVar1 != sVar4) {
        normidx_it._M_current._6_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1f8,"Normals faces count must be equal to mesh faces count.",
                   (allocator *)((long)&normidx_it._M_current + 7));
        DeadlyImportError::DeadlyImportError(pDVar6,&local_1f8);
        normidx_it._M_current._6_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      i_2 = (size_t)std::vector<int,_std::allocator<int>_>::begin(pNormalIdx);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &norm_arr_copy.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,sVar4);
      i_e = 0;
      local_218 = std::vector<int,_std::allocator<int>_>::size(pNormalIdx);
      for (; i_e < local_218; i_e = i_e + 1) {
        i_3 = (size_t)__gnu_cxx::
                      __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&i_2,0);
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&i_3);
        local_220 = (value_type_conflict1)*piVar7;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &norm_arr_copy.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_220);
      }
    }
    uVar8 = (ulong)pMesh->mNumVertices;
    paVar9 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar8 != 0) {
      local_328 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_328);
        local_328 = local_328 + 1;
      } while (local_328 != paVar9 + uVar8);
    }
    pMesh->mNormals = paVar9;
    tnorm.y = 0.0;
    tnorm.z = 0.0;
    for (; (ulong)tnorm._4_8_ < (ulong)pMesh->mNumFaces; tnorm._4_8_ = tnorm._4_8_ + 1) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&vi + 4));
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &norm_arr_copy.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,tnorm._4_8_);
      pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           local_68,*pvVar10);
      vi._4_4_ = pvVar11->x;
      unique0x00012004 = pvVar11->y;
      tnorm.x = pvVar11->z;
      vi_e = 0;
      uVar1 = pMesh->mFaces[tnorm._4_8_].mNumIndices;
      for (; vi_e < uVar1; vi_e = vi_e + 1) {
        paVar9 = pMesh->mNormals + pMesh->mFaces[tnorm._4_8_].mIndices[vi_e];
        paVar9->x = (float)vi._4_4_;
        paVar9->y = (float)unique0x00012004;
        paVar9->z = tnorm.x;
      }
    }
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &norm_arr_copy.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pNormalIdx,
								const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::vector<size_t> tind;
    std::vector<aiVector3D> norm_arr_copy;

	// copy list to array because we are need indexed access to normals.
	norm_arr_copy.reserve(pNormals.size());
    for ( std::list<aiVector3D>::const_iterator it = pNormals.begin(); it != pNormals.end(); ++it )
    {
        norm_arr_copy.push_back( *it );
    }

	if(pNormalPerVertex)
	{
		if(pNormalIdx.size() > 0)
		{
			// check indices array count.
			if(pNormalIdx.size() != pCoordIdx.size()) throw DeadlyImportError("Normals and Coords inidces count must be equal.");

			tind.reserve(pNormalIdx.size());
			for(std::vector<int32_t>::const_iterator it = pNormalIdx.begin(); it != pNormalIdx.end(); ++it)
			{
				if(*it != (-1)) tind.push_back(*it);
			}

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			for(size_t i = 0; (i < pMesh.mNumVertices) && (i < tind.size()); i++)
			{
				if(tind[i] >= norm_arr_copy.size())
					throw DeadlyImportError("MeshGeometry_AddNormal. Normal index(" + to_string(tind[i]) +
											") is out of range. Normals count: " + to_string(norm_arr_copy.size()) + ".");

				pMesh.mNormals[i] = norm_arr_copy[tind[i]];
			}
		}
		else
		{
			if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();
			for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
		}
	}// if(pNormalPerVertex)
	else
	{
		if(pNormalIdx.size() > 0)
		{
			if(pMesh.mNumFaces != pNormalIdx.size()) throw DeadlyImportError("Normals faces count must be equal to mesh faces count.");

			std::vector<int32_t>::const_iterator normidx_it = pNormalIdx.begin();

			tind.reserve(pNormalIdx.size());
			for(size_t i = 0, i_e = pNormalIdx.size(); i < i_e; i++) tind.push_back(*normidx_it++);

		}
		else
		{
			tind.reserve(pMesh.mNumFaces);
			for(size_t i = 0; i < pMesh.mNumFaces; i++) tind.push_back(i);

		}

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			aiVector3D tnorm;

			tnorm = norm_arr_copy[tind[fi]];
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = tnorm;
		}
	}// if(pNormalPerVertex) else
}